

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void gl4cts::TextureViewUtilities::getMajorMinorVersionFromContextVersion
               (ContextType *context_type,GLint *out_major_version,GLint *out_minor_version)

{
  uint uVar1;
  TestError *this;
  
  uVar1 = ((context_type->super_ApiType).m_bits & 0x3ff) - 0x104;
  uVar1 = uVar1 * 0x10000000 | uVar1 >> 4;
  if (uVar1 < 6) {
    *out_major_version = 4;
    *out_minor_version = uVar1;
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Unrecognized rendering context version",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
             ,0x680);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewUtilities::getMajorMinorVersionFromContextVersion(const glu::ContextType& context_type,
																  glw::GLint*			  out_major_version,
																  glw::GLint*			  out_minor_version)
{
	if (context_type.getAPI() == glu::ApiType::core(4, 0))
	{
		*out_major_version = 4;
		*out_minor_version = 0;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 1))
	{
		*out_major_version = 4;
		*out_minor_version = 1;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 2))
	{
		*out_major_version = 4;
		*out_minor_version = 2;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 3))
	{
		*out_major_version = 4;
		*out_minor_version = 3;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 4))
	{
		*out_major_version = 4;
		*out_minor_version = 4;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 5))
	{
		*out_major_version = 4;
		*out_minor_version = 5;
	}
	else
	{
		TCU_FAIL("Unrecognized rendering context version");
	}
}